

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
* __thiscall
Parser::parse(vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
              *__return_storage_ptr__,Parser *this)

{
  Token local_40;
  Parser local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    TokenStream::lookahead(&local_40,this->tokenStream);
    if (local_40.type == LeftBracket) {
      loop(&local_28);
      local_40.span.begin = (unsigned_long_long)local_28.tokenStream;
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_40);
    }
    else {
      if (local_40.type == EndOfFile) {
        return __return_storage_ptr__;
      }
      single((Parser *)&local_40);
      std::
      vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
      ::emplace_back<std::unique_ptr<Statement,std::default_delete<Statement>>>
                ((vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<Statement,_std::default_delete<Statement>_> *)&local_40);
    }
    if ((TokenStream *)local_40.span.begin != (TokenStream *)0x0) {
      operator_delete((void *)local_40.span.begin,8);
    }
  } while( true );
}

Assistant:

auto Parser::parse() -> std::vector<std::unique_ptr<Statement>> {
    auto statements = std::vector<std::unique_ptr<Statement>>();

    while (true) {
        auto lookaheadType = tokenStream.lookahead().type;

        if (lookaheadType == TokenKind::EndOfFile)
            break;

        if (lookaheadType == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    return statements;
}